

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestOutput.cpp
# Opt level: O1

void __thiscall TestOutput::printCurrentTestStarted(TestOutput *this,UtestShell *test)

{
  int iVar1;
  char *pcVar2;
  SimpleString SStack_28;
  
  if (0 < (int)this->verbose_) {
    (*test->_vptr_UtestShell[5])(&SStack_28,test);
    pcVar2 = SimpleString::asCharString(&SStack_28);
    (*this->_vptr_TestOutput[0xb])(this,pcVar2);
    SimpleString::~SimpleString(&SStack_28);
  }
  iVar1 = (*test->_vptr_UtestShell[6])(test);
  pcVar2 = "!";
  if ((char)iVar1 != '\0') {
    pcVar2 = ".";
  }
  (*this->_vptr_TestOutput[0x11])(this,pcVar2);
  return;
}

Assistant:

void TestOutput::printCurrentTestStarted(const UtestShell& test)
{
    if (verbose_ > level_quiet) print(test.getFormattedName().asCharString());

    if (test.willRun()) {
       setProgressIndicator(".");
    }
    else {
       setProgressIndicator("!");
    }
}